

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

bool upb::generator::ParseOptions(MiniTableOptions *options,Plugin *plugin)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  bool bVar1;
  char *in_RCX;
  Arg *in_R8;
  string_view sVar2;
  string_view format;
  Arg local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  string local_b0;
  string_view local_90;
  reference local_70;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pair;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_60;
  iterator __end2;
  iterator __begin2;
  char *local_48;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_28;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  Plugin *plugin_local;
  MiniTableOptions *options_local;
  
  __range2 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)plugin;
  plugin_local = (Plugin *)options;
  sVar2 = Plugin::parameter(plugin);
  __begin2._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)sVar2._M_len;
  local_48 = sVar2._M_str;
  sVar2._M_str = in_RCX;
  sVar2._M_len = (size_t)local_48;
  ParseGeneratorParameter_abi_cxx11_(&local_40,(generator *)__begin2._M_current,sVar2);
  local_28 = &local_40;
  __end2 = std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(local_28);
  local_60._M_current =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::end(local_28);
  do {
    bVar1 = __gnu_cxx::operator!=(&__end2,&local_60);
    if (!bVar1) {
      pair._4_4_ = 2;
LAB_00138df3:
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_40);
      if (pair._4_4_ != 1) {
        options_local._7_1_ = 1;
      }
      return (bool)(options_local._7_1_ & 1);
    }
    local_70 = __gnu_cxx::
               __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::operator*(&__end2);
    bVar1 = std::operator==(&local_70->first,"bootstrap_stage");
    if (bVar1) {
      *(undefined1 *)
       &(plugin_local->arena_).ptr_._M_t.super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>.
        _M_t.super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
        super__Tuple_impl<1UL,_void_(*)(upb_Arena_*)> = 1;
    }
    else {
      bVar1 = std::operator==(&local_70->first,"experimental_strip_nonfunctional_codegen");
      if (bVar1) {
        *(undefined1 *)
         ((long)&(plugin_local->arena_).ptr_._M_t.
                 super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                 super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                 super__Tuple_impl<1UL,_void_(*)(upb_Arena_*)> + 2) = 1;
      }
      else {
        bVar1 = std::operator==(&local_70->first,"one_output_per_message");
        this = __range2;
        if (!bVar1) {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_c0,"Unknown parameter: $0");
          absl::lts_20240722::substitute_internal::Arg::Arg<std::allocator<char>>
                    (&local_f0,&local_70->first);
          format._M_str = (char *)&local_f0;
          format._M_len = (size_t)local_c0._M_str;
          absl::lts_20240722::Substitute_abi_cxx11_
                    (&local_b0,(lts_20240722 *)local_c0._M_len,format,in_R8);
          local_90 = (string_view)
                     std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_b0);
          Plugin::SetError((Plugin *)this,local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          options_local._7_1_ = 0;
          pair._4_4_ = 1;
          goto LAB_00138df3;
        }
        *(undefined1 *)
         ((long)&(plugin_local->arena_).ptr_._M_t.
                 super___uniq_ptr_impl<upb_Arena,_void_(*)(upb_Arena_*)>._M_t.
                 super__Tuple_impl<0UL,_upb_Arena_*,_void_(*)(upb_Arena_*)>.
                 super__Tuple_impl<1UL,_void_(*)(upb_Arena_*)> + 1) = 1;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

bool ParseOptions(MiniTableOptions* options, Plugin* plugin) {
  for (const auto& pair : ParseGeneratorParameter(plugin->parameter())) {
    if (pair.first == "bootstrap_stage") {
      options->bootstrap = true;
    } else if (pair.first == "experimental_strip_nonfunctional_codegen") {
      options->strip_nonfunctional_codegen = true;
    } else if (pair.first == "one_output_per_message") {
      options->one_output_per_message = true;
    } else {
      plugin->SetError(absl::Substitute("Unknown parameter: $0", pair.first));
      return false;
    }
  }

  return true;
}